

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool system_input(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  gravity_value_t value;
  undefined8 uStack_430;
  char buffer [1024];
  
  bVar3 = true;
  if ((1 < nargs) && (args[1].isa == gravity_class_bool)) {
    bVar3 = args[1].field_1.n != 0;
  }
  uStack_430 = 0x11edea;
  pcVar1 = fgets(buffer,0x400,_stdin);
  if (pcVar1 == (char *)0x0) {
    value.field_1.n = 0;
    value.isa = gravity_class_null;
  }
  else {
    if (bVar3) {
      uStack_430 = 0x11edfc;
      sVar2 = strlen(buffer);
      buffer[sVar2 - 1] = '\0';
    }
    uStack_430 = 0x11ee10;
    value = gravity_string_to_value(vm,buffer,0xffffffff);
  }
  uStack_430 = 0x11ee2b;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool system_input (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    // optional argument is a boolean flag
    bool remove_trailing = true;
    if (nargs >= 2 && VALUE_ISA_BOOL(GET_VALUE(1))) remove_trailing = VALUE_AS_BOOL(GET_VALUE(1));
    
    char buffer[1024];
    if (fgets(buffer, sizeof(buffer), stdin) != NULL) {
        // remove trailing newline captured by fgets (default true)
        if (remove_trailing) buffer[strlen(buffer) - 1] = 0;
        RETURN_VALUE(VALUE_FROM_CSTRING(vm, buffer), rindex);
    }
    
    RETURN_VALUE(VALUE_FROM_NULL, rindex);
}